

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 sVar1;
  int iVar2;
  uint *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  uint in_R8D;
  stbi__context *in_R9;
  stbi_uc *out;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint b;
  undefined4 in_stack_ffffffffffffffbc;
  uint a;
  int *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffd0;
  uchar *local_8;
  
  sVar1 = stbi__pnm_info(in_R9,in_stack_ffffffffffffffc0,
                         (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  in_R9->img_x = sVar1;
  if (in_R9->img_x == 0) {
    local_8 = (uchar *)0x0;
  }
  else if (in_RDI[1] < 0x1000001) {
    if (*in_RDI < 0x1000001) {
      *in_RSI = *in_RDI;
      *in_RDX = in_RDI[1];
      if (in_RCX != (uint *)0x0) {
        *in_RCX = in_RDI[2];
      }
      a = in_RDI[1];
      iVar2 = stbi__mad4sizes_valid
                        (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
      if (iVar2 == 0) {
        stbi__err((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        local_8 = (uchar *)0x0;
      }
      else {
        b = in_RDI[1];
        local_8 = (uchar *)stbi__malloc_mad4(a,b,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                                             ,in_stack_ffffffffffffffac);
        if (local_8 == (uchar *)0x0) {
          stbi__err((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          local_8 = (uchar *)0x0;
        }
        else {
          stbi__getn((stbi__context *)CONCAT44(a,b),
                     (stbi_uc *)CONCAT44(in_RDI[2] * *in_RDI * in_RDI[1],in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffac);
          if ((in_R8D != 0) && (in_R8D != in_RDI[2])) {
            local_8 = stbi__convert_format
                                ((uchar *)in_RCX,in_R8D,in_stack_ffffffffffffffd0,
                                 (uint)((ulong)in_R9 >> 0x20),(uint)in_R9);
          }
        }
      }
    }
    else {
      stbi__err((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      local_8 = (uchar *)0x0;
    }
  }
  else {
    stbi__err((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   ri->bits_per_channel = stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n);
   if (ri->bits_per_channel == 0)
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad4sizes_valid(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad4(s->img_n, s->img_x, s->img_y, ri->bits_per_channel / 8, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y * (ri->bits_per_channel / 8));

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}